

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O1

void __thiscall
Js::LiteralStringWithPropertyStringPtr::SetPropertyString
          (LiteralStringWithPropertyStringPtr *this,PropertyString *propStr)

{
  PropertyRecord *in_RAX;
  Type local_28;
  PropertyRecord *localPropertyRecord;
  
  local_28.ptr = in_RAX;
  Memory::Recycler::WBSetBit((char *)&this->propertyString);
  (this->propertyString).ptr = propStr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->propertyString);
  if (propStr != (PropertyString *)0x0) {
    (*(propStr->super_JavascriptString).super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x61])(propStr,&local_28,0);
    Memory::Recycler::WBSetBit((char *)&this->propertyRecord);
    (this->propertyRecord).ptr = local_28.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->propertyRecord);
  }
  return;
}

Assistant:

void LiteralStringWithPropertyStringPtr::SetPropertyString(PropertyString * propStr)
    {
        this->propertyString = propStr;
        if (propStr != nullptr)
        {
            Js::PropertyRecord const * localPropertyRecord;
            propStr->GetPropertyRecord(&localPropertyRecord);
            this->propertyRecord = localPropertyRecord;
        }
    }